

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slufactor.hpp
# Opt level: O1

number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::matrixMetric(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *__return_storage_ptr__,
              SLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *this,int type)

{
  uint *puVar1;
  undefined1 (*pauVar2) [16];
  pointer pnVar3;
  undefined1 auVar4 [16];
  int iVar5;
  cpp_dec_float<100U,_int,_void> *v;
  long lVar6;
  long lVar7;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_2;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  undefined1 local_248 [16];
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  uint local_218 [3];
  undefined3 uStack_20b;
  int iStack_208;
  bool bStack_204;
  undefined8 local_200;
  cpp_dec_float<100U,_int,_void> local_1f8;
  cpp_dec_float<100U,_int,_void> local_1a8;
  cpp_dec_float<100U,_int,_void> local_158;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_100;
  undefined8 local_f8;
  undefined8 uStack_f0;
  undefined8 local_e8;
  undefined8 uStack_e0;
  undefined8 local_d8;
  undefined8 uStack_d0;
  uint local_c8 [2];
  undefined8 uStack_c0;
  uint local_b8 [2];
  uint auStack_b0 [2];
  uint local_a8;
  uint uStack_a4;
  uint uStack_a0;
  uint uStack_9c;
  uint local_98;
  uint uStack_94;
  uint uStack_90;
  uint uStack_8c;
  uint local_88;
  uint uStack_84;
  uint uStack_80;
  uint uStack_7c;
  uint local_78 [2];
  uint auStack_70 [2];
  uint local_68 [2];
  uint auStack_60 [2];
  uint local_58 [2];
  uint auStack_50 [2];
  uint local_48 [2];
  undefined8 uStack_40;
  
  local_1a8.fpclass = cpp_dec_float_finite;
  local_1a8.prec_elem = 0x10;
  local_1a8.data._M_elems[0] = 0;
  local_1a8.data._M_elems[1] = 0;
  local_1a8.data._M_elems[2] = 0;
  local_1a8.data._M_elems[3] = 0;
  local_1a8.data._M_elems[4] = 0;
  local_1a8.data._M_elems[5] = 0;
  local_1a8.data._M_elems[6] = 0;
  local_1a8.data._M_elems[7] = 0;
  local_1a8.data._M_elems[8] = 0;
  local_1a8.data._M_elems[9] = 0;
  local_1a8.data._M_elems[10] = 0;
  local_1a8.data._M_elems[0xb] = 0;
  local_1a8.data._M_elems[0xc] = 0;
  local_1a8.data._M_elems[0xd] = 0;
  local_1a8.data._M_elems._56_5_ = 0;
  local_1a8.data._M_elems[0xf]._1_3_ = 0;
  local_1a8.exp = 0;
  local_1a8.neg = false;
  boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
            ((cpp_dec_float<100u,int,void> *)&local_1a8,0.0);
  iVar5 = (*(this->
            super_SLinSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            )._vptr_SLinSolver[4])(this);
  local_100 = __return_storage_ptr__;
  if (iVar5 == 0) {
    (__return_storage_ptr__->m_backend).fpclass = cpp_dec_float_finite;
    (__return_storage_ptr__->m_backend).prec_elem = 0x10;
    (__return_storage_ptr__->m_backend).data._M_elems[0] = 0;
    (__return_storage_ptr__->m_backend).data._M_elems[1] = 0;
    (__return_storage_ptr__->m_backend).data._M_elems[2] = 0;
    (__return_storage_ptr__->m_backend).data._M_elems[3] = 0;
    (__return_storage_ptr__->m_backend).data._M_elems[4] = 0;
    (__return_storage_ptr__->m_backend).data._M_elems[5] = 0;
    (__return_storage_ptr__->m_backend).data._M_elems[6] = 0;
    (__return_storage_ptr__->m_backend).data._M_elems[7] = 0;
    (__return_storage_ptr__->m_backend).data._M_elems[8] = 0;
    (__return_storage_ptr__->m_backend).data._M_elems[9] = 0;
    (__return_storage_ptr__->m_backend).data._M_elems[10] = 0;
    (__return_storage_ptr__->m_backend).data._M_elems[0xb] = 0;
    (__return_storage_ptr__->m_backend).data._M_elems[0xc] = 0;
    (__return_storage_ptr__->m_backend).data._M_elems[0xd] = 0;
    (__return_storage_ptr__->m_backend).data._M_elems[0xe] = 0;
    (__return_storage_ptr__->m_backend).data._M_elems[0xf] = 0;
    *(undefined8 *)((long)(__return_storage_ptr__->m_backend).data._M_elems + 0x3d) = 0;
    boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
              ((cpp_dec_float<100u,int,void> *)__return_storage_ptr__,1.0);
  }
  else {
    if (type == 2) {
      boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                ((cpp_dec_float<100u,int,void> *)&local_1a8,1.0);
      iVar5 = (*(this->
                super_SLinSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                )._vptr_SLinSolver[4])(this);
      if (0 < iVar5) {
        lVar6 = 0;
        lVar7 = 0;
        do {
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator*=
                    (&local_1a8,
                     (cpp_dec_float<100U,_int,_void> *)
                     ((long)(((this->
                              super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                              ).diag.
                              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                              ._M_impl.super__Vector_impl_data._M_start)->m_backend).data._M_elems +
                     lVar6));
          lVar7 = lVar7 + 1;
          iVar5 = (*(this->
                    super_SLinSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    )._vptr_SLinSolver[4])(this);
          lVar6 = lVar6 + 0x50;
        } while (lVar7 < iVar5);
      }
      local_1f8.fpclass = cpp_dec_float_finite;
      local_1f8.prec_elem = 0x10;
      local_1f8.data._M_elems[0] = 0;
      local_1f8.data._M_elems[1] = 0;
      local_1f8.data._M_elems[2] = 0;
      local_1f8.data._M_elems[3] = 0;
      local_1f8.data._M_elems[4] = 0;
      local_1f8.data._M_elems[5] = 0;
      local_1f8.data._M_elems[6] = 0;
      local_1f8.data._M_elems[7] = 0;
      local_1f8.data._M_elems[8] = 0;
      local_1f8.data._M_elems[9] = 0;
      local_1f8.data._M_elems[10] = 0;
      local_1f8.data._M_elems[0xb] = 0;
      local_1f8.data._M_elems[0xc] = 0;
      local_1f8.data._M_elems[0xd] = 0;
      local_1f8.data._M_elems[0xe] = 0;
      local_1f8.data._M_elems[0xf] = 0;
      local_1f8.exp = 0;
      local_1f8.neg = false;
      local_158.fpclass = cpp_dec_float_finite;
      local_158.prec_elem = 0x10;
      local_158.data._M_elems[0] = 0;
      local_158.data._M_elems[1] = 0;
      local_158.data._M_elems[2] = 0;
      local_158.data._M_elems[3] = 0;
      local_158.data._M_elems[4] = 0;
      local_158.data._M_elems[5] = 0;
      local_158.data._M_elems[6] = 0;
      local_158.data._M_elems[7] = 0;
      local_158.data._M_elems[8] = 0;
      local_158.data._M_elems[9] = 0;
      local_158.data._M_elems[10] = 0;
      local_158.data._M_elems[0xb] = 0;
      local_158.data._M_elems[0xc] = 0;
      local_158.data._M_elems[0xd] = 0;
      local_158.data._M_elems._56_5_ = 0;
      local_158.data._M_elems[0xf]._1_3_ = 0;
      local_158.exp = 0;
      local_158.neg = false;
      boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                ((cpp_dec_float<100u,int,void> *)&local_158,1.0);
      boost::multiprecision::default_ops::
      eval_divide<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                (&local_1f8,&local_158,&local_1a8);
      local_1a8.data._M_elems[0] = local_1f8.data._M_elems[0];
      local_1a8.data._M_elems[1] = local_1f8.data._M_elems[1];
      local_1a8.data._M_elems[2] = local_1f8.data._M_elems[2];
      local_1a8.data._M_elems[3] = local_1f8.data._M_elems[3];
      local_1a8.data._M_elems[4] = local_1f8.data._M_elems[4];
      local_1a8.data._M_elems[5] = local_1f8.data._M_elems[5];
      local_1a8.data._M_elems[6] = local_1f8.data._M_elems[6];
      local_1a8.data._M_elems[7] = local_1f8.data._M_elems[7];
      local_1a8.data._M_elems[8] = local_1f8.data._M_elems[8];
      local_1a8.data._M_elems[9] = local_1f8.data._M_elems[9];
      local_1a8.data._M_elems[10] = local_1f8.data._M_elems[10];
      local_1a8.data._M_elems[0xb] = local_1f8.data._M_elems[0xb];
      local_1a8.data._M_elems[0xc] = local_1f8.data._M_elems[0xc];
      local_1a8.data._M_elems[0xd] = local_1f8.data._M_elems[0xd];
      local_1a8.data._M_elems._56_5_ =
           SUB85(CONCAT44(local_1f8.data._M_elems[0xf],local_1f8.data._M_elems[0xe]),0);
      local_1a8.data._M_elems[0xf]._1_3_ = (undefined3)(local_1f8.data._M_elems[0xf] >> 8);
      local_1a8.exp = local_1f8.exp;
      local_1a8.neg = local_1f8.neg;
      local_1a8.fpclass = local_1f8.fpclass;
      local_1a8.prec_elem = local_1f8.prec_elem;
    }
    else if (type == 1) {
      boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                ((cpp_dec_float<100u,int,void> *)&local_1a8,0.0);
      iVar5 = (*(this->
                super_SLinSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                )._vptr_SLinSolver[4])(this);
      if (0 < iVar5) {
        lVar7 = 0;
        lVar6 = 0;
        do {
          pnVar3 = (this->
                   super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).diag.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_1f8.fpclass = cpp_dec_float_finite;
          local_1f8.prec_elem = 0x10;
          local_1f8.data._M_elems[0] = 0;
          local_1f8.data._M_elems[1] = 0;
          local_1f8.data._M_elems[2] = 0;
          local_1f8.data._M_elems[3] = 0;
          local_1f8.data._M_elems[4] = 0;
          local_1f8.data._M_elems[5] = 0;
          local_1f8.data._M_elems[6] = 0;
          local_1f8.data._M_elems[7] = 0;
          local_1f8.data._M_elems[8] = 0;
          local_1f8.data._M_elems[9] = 0;
          local_1f8.data._M_elems[10] = 0;
          local_1f8.data._M_elems[0xb] = 0;
          local_1f8.data._M_elems[0xc] = 0;
          local_1f8.data._M_elems[0xd] = 0;
          local_1f8.data._M_elems[0xe] = 0;
          local_1f8.data._M_elems[0xf] = 0;
          local_1f8.exp = 0;
          local_1f8.neg = false;
          local_158.fpclass = cpp_dec_float_finite;
          local_158.prec_elem = 0x10;
          local_158.data._M_elems[0] = 0;
          local_158.data._M_elems[1] = 0;
          local_158.data._M_elems[2] = 0;
          local_158.data._M_elems[3] = 0;
          local_158.data._M_elems[4] = 0;
          local_158.data._M_elems[5] = 0;
          local_158.data._M_elems[6] = 0;
          local_158.data._M_elems[7] = 0;
          local_158.data._M_elems[8] = 0;
          local_158.data._M_elems[9] = 0;
          local_158.data._M_elems[10] = 0;
          local_158.data._M_elems[0xb] = 0;
          local_158.data._M_elems[0xc] = 0;
          local_158.data._M_elems[0xd] = 0;
          local_158.data._M_elems._56_5_ = 0;
          local_158.data._M_elems[0xf]._1_3_ = 0;
          local_158.exp = 0;
          local_158.neg = false;
          boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                    ((cpp_dec_float<100u,int,void> *)&local_158,1.0);
          boost::multiprecision::default_ops::
          eval_divide<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                    (&local_1f8,&local_158,
                     (cpp_dec_float<100U,_int,_void> *)
                     ((long)(pnVar3->m_backend).data._M_elems + lVar7));
          boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::operator+=
                    (&local_1a8,&local_1f8);
          lVar6 = lVar6 + 1;
          iVar5 = (*(this->
                    super_SLinSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    )._vptr_SLinSolver[4])(this);
          lVar7 = lVar7 + 0x50;
        } while (lVar6 < iVar5);
      }
    }
    else if (type == 0) {
      pnVar3 = (this->
               super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).diag.
               super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      local_158.data._M_elems._0_8_ = *(undefined8 *)(pnVar3->m_backend).data._M_elems;
      local_158.data._M_elems._8_8_ = *(undefined8 *)((pnVar3->m_backend).data._M_elems + 2);
      local_158.data._M_elems._16_8_ = *(undefined8 *)((pnVar3->m_backend).data._M_elems + 4);
      local_158.data._M_elems._24_8_ = *(undefined8 *)((pnVar3->m_backend).data._M_elems + 6);
      local_158.data._M_elems._32_8_ = *(undefined8 *)((pnVar3->m_backend).data._M_elems + 8);
      local_158.data._M_elems._40_8_ = *(undefined8 *)((pnVar3->m_backend).data._M_elems + 10);
      local_158.data._M_elems._48_8_ = *(undefined8 *)((pnVar3->m_backend).data._M_elems + 0xc);
      uStack_40 = *(undefined8 *)((pnVar3->m_backend).data._M_elems + 0xe);
      local_158.exp = (pnVar3->m_backend).exp;
      local_158.neg = (pnVar3->m_backend).neg;
      local_158.data._M_elems._56_5_ = SUB85(uStack_40,0);
      local_158.data._M_elems[0xf]._1_3_ = (undefined3)((ulong)uStack_40 >> 0x28);
      local_158.fpclass = (pnVar3->m_backend).fpclass;
      local_158.prec_elem = (pnVar3->m_backend).prec_elem;
      if ((local_158.neg == true) &&
         (local_158.fpclass != cpp_dec_float_finite || local_158.data._M_elems[0] != 0)) {
        local_158.neg = false;
      }
      local_1f8.data._M_elems._0_8_ = *(undefined8 *)(pnVar3->m_backend).data._M_elems;
      local_1f8.data._M_elems._8_8_ = *(undefined8 *)((pnVar3->m_backend).data._M_elems + 2);
      puVar1 = (pnVar3->m_backend).data._M_elems + 4;
      local_a8 = *puVar1;
      uStack_a4 = (pnVar3->m_backend).data._M_elems[5];
      local_1f8.data._M_elems._16_8_ = *(undefined8 *)puVar1;
      puVar1 = (pnVar3->m_backend).data._M_elems + 6;
      uStack_a0 = *puVar1;
      uStack_9c = (pnVar3->m_backend).data._M_elems[7];
      local_1f8.data._M_elems._24_8_ = *(undefined8 *)puVar1;
      puVar1 = (pnVar3->m_backend).data._M_elems + 8;
      local_98 = *puVar1;
      uStack_94 = (pnVar3->m_backend).data._M_elems[9];
      local_1f8.data._M_elems._32_8_ = *(undefined8 *)puVar1;
      puVar1 = (pnVar3->m_backend).data._M_elems + 10;
      uStack_90 = *puVar1;
      uStack_8c = (pnVar3->m_backend).data._M_elems[0xb];
      local_1f8.data._M_elems._40_8_ = *(undefined8 *)puVar1;
      puVar1 = (pnVar3->m_backend).data._M_elems + 0xc;
      local_88 = *puVar1;
      uStack_84 = (pnVar3->m_backend).data._M_elems[0xd];
      local_1f8.data._M_elems._48_8_ = *(undefined8 *)puVar1;
      local_1f8.data._M_elems[0xe] = (pnVar3->m_backend).data._M_elems[0xe];
      local_1f8.data._M_elems[0xf] = (pnVar3->m_backend).data._M_elems[0xf];
      local_1f8.exp = (pnVar3->m_backend).exp;
      local_1f8.neg = (pnVar3->m_backend).neg;
      local_1f8.fpclass = (pnVar3->m_backend).fpclass;
      local_1f8.prec_elem = (pnVar3->m_backend).prec_elem;
      if ((local_1f8.neg == true) &&
         (local_1f8.fpclass != cpp_dec_float_finite || local_1f8.data._M_elems[0] != 0)) {
        local_1f8.neg = false;
      }
      local_b8 = (uint  [2])local_1f8.data._M_elems._0_8_;
      auStack_b0 = (uint  [2])local_1f8.data._M_elems._8_8_;
      uStack_80 = local_1f8.data._M_elems[0xe];
      uStack_7c = local_1f8.data._M_elems[0xf];
      local_78 = (uint  [2])local_158.data._M_elems._0_8_;
      auStack_70 = (uint  [2])local_158.data._M_elems._8_8_;
      local_68 = (uint  [2])local_158.data._M_elems._16_8_;
      auStack_60 = (uint  [2])local_158.data._M_elems._24_8_;
      local_58 = (uint  [2])local_158.data._M_elems._32_8_;
      auStack_50 = (uint  [2])local_158.data._M_elems._40_8_;
      local_48 = (uint  [2])local_158.data._M_elems._48_8_;
      iVar5 = (*(this->
                super_SLinSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                )._vptr_SLinSolver[4])(this);
      if (1 < iVar5) {
        lVar6 = 1;
        lVar7 = 0x98;
        do {
          pnVar3 = (this->
                   super_CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                   ).diag.
                   super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          pauVar2 = (undefined1 (*) [16])((long)(pnVar3->m_backend).data._M_elems + lVar7 + -0x48);
          local_f8 = *(undefined8 *)*pauVar2;
          uStack_f0 = *(undefined8 *)(*pauVar2 + 8);
          auVar4 = *pauVar2;
          pauVar2 = (undefined1 (*) [16])((long)(pnVar3->m_backend).data._M_elems + lVar7 + -0x38);
          local_e8 = *(undefined8 *)*pauVar2;
          uStack_e0 = *(undefined8 *)(*pauVar2 + 8);
          local_238 = *pauVar2;
          pauVar2 = (undefined1 (*) [16])((long)(pnVar3->m_backend).data._M_elems + lVar7 + -0x28);
          local_d8 = *(undefined8 *)*pauVar2;
          uStack_d0 = *(undefined8 *)(*pauVar2 + 8);
          local_228 = *pauVar2;
          puVar1 = (uint *)((long)(pnVar3->m_backend).data._M_elems + lVar7 + -0x18);
          local_218._0_8_ = *(undefined8 *)puVar1;
          uStack_c0 = *(undefined8 *)(puVar1 + 2);
          iStack_208 = *(int *)((long)(pnVar3->m_backend).data._M_elems + lVar7 + -8);
          bStack_204 = *(bool *)((long)(pnVar3->m_backend).data._M_elems + lVar7 + -4);
          local_200 = *(undefined8 *)((long)(pnVar3->m_backend).data._M_elems + lVar7);
          stack0xfffffffffffffdf0 = (undefined5)uStack_c0;
          uStack_20b = (undefined3)((ulong)uStack_c0 >> 0x28);
          if ((bStack_204 == true) &&
             (local_248._0_4_ = (undefined4)local_f8,
             local_248._0_4_ != 0 || (fpclass_type)local_200 != cpp_dec_float_finite)) {
            bStack_204 = false;
          }
          local_248 = auVar4;
          local_c8 = (uint  [2])local_218._0_8_;
          if (((fpclass_type)local_200 == cpp_dec_float_NaN) ||
             (local_158.fpclass == cpp_dec_float_NaN)) {
LAB_003e1b7b:
            if (((fpclass_type)local_200 != cpp_dec_float_NaN) &&
               (local_1f8.fpclass != cpp_dec_float_NaN)) {
              v = &local_1f8;
              iVar5 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                                ((cpp_dec_float<100U,_int,_void> *)local_248,v);
              if (0 < iVar5) goto LAB_003e1ba9;
            }
          }
          else {
            v = &local_158;
            iVar5 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                              ((cpp_dec_float<100U,_int,_void> *)local_248,v);
            if (-1 < iVar5) goto LAB_003e1b7b;
LAB_003e1ba9:
            *(undefined8 *)((v->data)._M_elems + 0xc) = local_218._0_8_;
            *(ulong *)((v->data)._M_elems + 0xe) = CONCAT35(uStack_20b,stack0xfffffffffffffdf0);
            *(undefined8 *)((v->data)._M_elems + 8) = local_228._0_8_;
            *(undefined8 *)((v->data)._M_elems + 10) = local_228._8_8_;
            *(undefined8 *)((v->data)._M_elems + 4) = local_238._0_8_;
            *(undefined8 *)((v->data)._M_elems + 6) = local_238._8_8_;
            *(undefined8 *)(v->data)._M_elems = local_248._0_8_;
            *(undefined8 *)((v->data)._M_elems + 2) = local_248._8_8_;
            v->exp = iStack_208;
            v->neg = bStack_204;
            v->fpclass = (fpclass_type)local_200;
            v->prec_elem = local_200._4_4_;
          }
          lVar6 = lVar6 + 1;
          iVar5 = (*(this->
                    super_SLinSolver<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                    )._vptr_SLinSolver[4])(this);
          lVar7 = lVar7 + 0x50;
        } while (lVar6 < iVar5);
      }
      local_200._0_4_ = cpp_dec_float_finite;
      local_200._4_4_ = 0x10;
      local_248 = (undefined1  [16])0x0;
      local_238 = (undefined1  [16])0x0;
      local_228 = (undefined1  [16])0x0;
      local_218[0] = 0;
      local_218[1] = 0;
      stack0xfffffffffffffdf0 = 0;
      uStack_20b = 0;
      iStack_208 = 0;
      bStack_204 = false;
      boost::multiprecision::default_ops::
      eval_divide<boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>,boost::multiprecision::backends::cpp_dec_float<100u,int,void>>
                ((cpp_dec_float<100U,_int,_void> *)local_248,&local_1f8,&local_158);
      local_1a8.data._M_elems[0xc] = local_218[0];
      local_1a8.data._M_elems[0xd] = local_218[1];
      local_1a8.data._M_elems._56_5_ = stack0xfffffffffffffdf0;
      local_1a8.data._M_elems[0xf]._1_3_ = uStack_20b;
      local_1a8.data._M_elems[8] = local_228._0_4_;
      local_1a8.data._M_elems[9] = local_228._4_4_;
      local_1a8.data._M_elems[10] = local_228._8_4_;
      local_1a8.data._M_elems[0xb] = local_228._12_4_;
      local_1a8.data._M_elems[4] = local_238._0_4_;
      local_1a8.data._M_elems[5] = local_238._4_4_;
      local_1a8.data._M_elems[6] = local_238._8_4_;
      local_1a8.data._M_elems[7] = local_238._12_4_;
      local_1a8.data._M_elems[0] = local_248._0_4_;
      local_1a8.data._M_elems[1] = local_248._4_4_;
      local_1a8.data._M_elems[2] = local_248._8_4_;
      local_1a8.data._M_elems[3] = local_248._12_4_;
      local_1a8.exp = iStack_208;
      local_1a8.neg = bStack_204;
      local_1a8.fpclass = (fpclass_type)local_200;
      local_1a8.prec_elem = local_200._4_4_;
    }
    *(undefined8 *)((local_100->m_backend).data._M_elems + 0xc) = local_1a8.data._M_elems._48_8_;
    *(ulong *)((local_100->m_backend).data._M_elems + 0xe) =
         CONCAT35(local_1a8.data._M_elems[0xf]._1_3_,local_1a8.data._M_elems._56_5_);
    *(undefined8 *)((local_100->m_backend).data._M_elems + 8) = local_1a8.data._M_elems._32_8_;
    *(undefined8 *)((local_100->m_backend).data._M_elems + 10) = local_1a8.data._M_elems._40_8_;
    *(undefined8 *)((local_100->m_backend).data._M_elems + 4) = local_1a8.data._M_elems._16_8_;
    *(undefined8 *)((local_100->m_backend).data._M_elems + 6) = local_1a8.data._M_elems._24_8_;
    *(undefined8 *)(local_100->m_backend).data._M_elems = local_1a8.data._M_elems._0_8_;
    *(undefined8 *)((local_100->m_backend).data._M_elems + 2) = local_1a8.data._M_elems._8_8_;
    (local_100->m_backend).exp = local_1a8.exp;
    (local_100->m_backend).neg = local_1a8.neg;
    (local_100->m_backend).fpclass = local_1a8.fpclass;
    (local_100->m_backend).prec_elem = local_1a8.prec_elem;
  }
  return local_100;
}

Assistant:

R SLUFactor<R>::matrixMetric(int type) const
{
   R result = 0.0;

   // catch corner case of empty matrix
   if(dim() == 0)
      return 1.0;

   switch(type)
   {
   // compute condition estimate by ratio of max/min of elements on the diagonal
   case 0:
   {
      R mindiag = spxAbs(this->diag[0]);
      R maxdiag = spxAbs(this->diag[0]);

      for(int i = 1; i < dim(); ++i)
      {
         R absdiag = spxAbs(this->diag[i]);

         if(absdiag < mindiag)
            mindiag = absdiag;
         else if(absdiag > maxdiag)
            maxdiag = absdiag;
      }

      result = maxdiag / mindiag;
      break;
   }

   // compute sum of inverses of all elements on the diagonal
   case 1:
      result = 0.0;

      for(int i = 0; i < dim(); ++i)
         result += 1.0 / this->diag[i];

      break;

   // compute determinant (product of all diagonal elements of U)
   case 2:
      result = 1.0;

      for(int i = 0; i < dim(); ++i)
         result *= this->diag[i];

      result = 1.0 / result;
      break;
   }

   return result;
}